

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

StringRef llvm::Triple::getVendorTypeName(VendorType Kind)

{
  undefined1 auStack_128 [4];
  VendorType Kind_local;
  char *local_118;
  undefined1 *local_110;
  char *local_108;
  undefined1 *local_100;
  char *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  char *local_98;
  undefined1 *local_90;
  char *local_88;
  undefined1 *local_80;
  char *local_78;
  undefined1 *local_70;
  char *local_68;
  undefined1 *local_60;
  char *local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 *local_40;
  char *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  char *local_18;
  undefined1 *local_10;
  
  switch(Kind) {
  case UnknownVendor:
    local_110 = auStack_128;
    local_118 = "unknown";
    strlen("unknown");
    break;
  case Apple:
    local_100 = auStack_128;
    local_108 = "apple";
    strlen("apple");
    break;
  case PC:
    local_f0 = auStack_128;
    local_f8 = "pc";
    strlen("pc");
    break;
  case SCEI:
    local_e0 = auStack_128;
    local_e8 = "scei";
    strlen("scei");
    break;
  case BGP:
    local_d0 = auStack_128;
    local_d8 = "bgp";
    strlen("bgp");
    break;
  case BGQ:
    local_c0 = auStack_128;
    local_c8 = "bgq";
    strlen("bgq");
    break;
  case Freescale:
    local_b0 = auStack_128;
    local_b8 = "fsl";
    strlen("fsl");
    break;
  case IBM:
    local_a0 = auStack_128;
    local_a8 = "ibm";
    strlen("ibm");
    break;
  case ImaginationTechnologies:
    local_90 = auStack_128;
    local_98 = "img";
    strlen("img");
    break;
  case MipsTechnologies:
    local_80 = auStack_128;
    local_88 = "mti";
    strlen("mti");
    break;
  case NVIDIA:
    local_70 = auStack_128;
    local_78 = "nvidia";
    strlen("nvidia");
    break;
  case CSR:
    local_60 = auStack_128;
    local_68 = "csr";
    strlen("csr");
    break;
  case Myriad:
    local_50 = auStack_128;
    local_58 = "myriad";
    strlen("myriad");
    break;
  case AMD:
    local_40 = auStack_128;
    local_48 = "amd";
    strlen("amd");
    break;
  case Mesa:
    local_30 = auStack_128;
    local_38 = "mesa";
    strlen("mesa");
    break;
  case SUSE:
    local_20 = auStack_128;
    local_28 = "suse";
    strlen("suse");
    break;
  case LastVendorType:
    local_10 = auStack_128;
    local_18 = "oe";
    strlen("oe");
    break;
  default:
    llvm_unreachable_internal
              ("Invalid VendorType!",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
               ,0xae);
  }
  return _auStack_128;
}

Assistant:

StringRef Triple::getVendorTypeName(VendorType Kind) {
  switch (Kind) {
  case UnknownVendor: return "unknown";

  case Apple: return "apple";
  case PC: return "pc";
  case SCEI: return "scei";
  case BGP: return "bgp";
  case BGQ: return "bgq";
  case Freescale: return "fsl";
  case IBM: return "ibm";
  case ImaginationTechnologies: return "img";
  case MipsTechnologies: return "mti";
  case NVIDIA: return "nvidia";
  case CSR: return "csr";
  case Myriad: return "myriad";
  case AMD: return "amd";
  case Mesa: return "mesa";
  case SUSE: return "suse";
  case OpenEmbedded: return "oe";
  }

  llvm_unreachable("Invalid VendorType!");
}